

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

real __thiscall fasttext::Matrix::l2NormRow(Matrix *this,int64_t i)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  runtime_error *this_00;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [64];
  
  uVar2 = this->n_;
  auVar6 = ZEXT1664(ZEXT816(0) << 0x40);
  for (uVar4 = 0; dVar5 = auVar6._0_8_, (~((long)uVar2 >> 0x3f) & uVar2) != uVar4; uVar4 = uVar4 + 1
      ) {
    fVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[i * uVar2 + uVar4];
    auVar6 = ZEXT864((ulong)(dVar5 + (double)(fVar1 * fVar1)));
  }
  if (!NAN(dVar5)) {
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      auVar3 = vsqrtsd_avx(auVar6._0_16_,auVar6._0_16_);
      dVar5 = auVar3._0_8_;
    }
    return (float)dVar5;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Encountered NaN.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

real Matrix::l2NormRow(int64_t i) const {
  auto norm = 0.0;
  for (auto j = 0; j < n_; j++) {
    norm += at(i, j) * at(i, j);
  }
  if (std::isnan(norm)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return std::sqrt(norm);
}